

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O1

void __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBoxDoIt
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArrayId fabarrayid,Box *destFabBox,
          BoxList *returnedUnfilledBoxes,int faindex,int srccomp,int destcomp,int numcomp,
          bool bUseValidBox,BoxDomain *unfilledBoxDomain)

{
  pointer *ppFVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 *puVar6;
  FArrayBox *this_00;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  ulong *puVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  FabArray<amrex::FArrayBox> *this_01;
  iterator __position;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  string __str_1;
  string __str_2;
  FabComTag fabComTag;
  string __str;
  Box local_1d8;
  undefined4 local_1b8;
  int local_1b4;
  long local_1b0;
  ulong local_1a8;
  int local_1a0;
  int local_19c;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  ulong local_88;
  int iStack_80;
  int iStack_7c;
  int iStack_78;
  undefined8 uStack_74;
  FabArray<amrex::FArrayBox> *local_68;
  FabArrayCopyDescriptor<amrex::FArrayBox> *local_60;
  BoxList *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  bVar17 = 0;
  local_1b8 = *(undefined4 *)(ParallelContext::frames + 0xc);
  this_01 = (this->fabArrays).
            super__Vector_base<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start[fabarrayid.fabArrayId];
  local_1d8.smallend.vect._0_8_ = *(undefined8 *)(destFabBox->smallend).vect;
  uVar2 = *(undefined8 *)((destFabBox->smallend).vect + 2);
  local_1d8._20_8_ = *(undefined8 *)((destFabBox->bigend).vect + 2);
  local_1d8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(destFabBox->bigend).vect >> 0x20);
  local_1d8.smallend.vect[2] = (int)uVar2;
  local_1d8.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
  local_1b4 = srccomp;
  local_19c = fabarrayid.fabArrayId;
  if (bUseValidBox) {
    BATransformer::operator()
              ((Box *)local_b8,&(this_01->super_FabArrayBase).boxarray.m_bat,
               (Box *)((long)faindex * 0x1c +
                      *(long *)(((shared_ptr<amrex::BARef> *)
                                ((long)&(this_01->super_FabArrayBase).boxarray + 0x48))->
                               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              );
  }
  else {
    FabArrayBase::fabbox((Box *)local_b8,&this_01->super_FabArrayBase,faindex);
  }
  uVar18 = CONCAT44(-(uint)((int)local_b8._4_4_ < local_1d8.smallend.vect[1]),
                    -(uint)((int)local_b8._0_4_ < local_1d8.smallend.vect[0]));
  uVar18 = ~uVar18 & CONCAT44(local_b8._4_4_,local_b8._0_4_) |
           local_1d8.smallend.vect._0_8_ & uVar18;
  iVar3 = local_b8._8_4_;
  if ((int)local_b8._8_4_ < local_1d8.smallend.vect[2]) {
    iVar3 = local_1d8.smallend.vect[2];
  }
  uVar19 = CONCAT44(-(uint)(local_1d8.bigend.vect[1] < (int)local_b8._16_4_),
                    -(uint)(local_1d8.bigend.vect[0] < (int)local_b8._12_4_));
  uVar19 = ~uVar19 & CONCAT44(local_b8._16_4_,local_b8._12_4_) |
           CONCAT44(local_1d8.bigend.vect[1],local_1d8.bigend.vect[0]) & uVar19;
  local_1d8.bigend.vect[0] = (int)uVar19;
  local_1d8.bigend.vect[1] = (int)(uVar19 >> 0x20);
  iVar13 = local_b8._20_4_;
  if (local_1d8.bigend.vect[2] < (int)local_b8._20_4_) {
    iVar13 = local_1d8.bigend.vect[2];
  }
  local_1d8.bigend.vect[2] = iVar13;
  local_1d8.smallend.vect[0] = (int)uVar18;
  if (local_1d8.bigend.vect[0] < local_1d8.smallend.vect[0]) {
    return;
  }
  local_1d8.smallend.vect[1] = (int)(uVar18 >> 0x20);
  if (local_1d8.bigend.vect[1] < local_1d8.smallend.vect[1]) {
    return;
  }
  if (iVar13 < iVar3) {
    return;
  }
  if (7 < local_1d8.btype.itype) {
    return;
  }
  local_1d8.smallend.vect._0_8_ = uVar18;
  local_1d8.smallend.vect[2] = iVar3;
  local_1b0 = (long)fabarrayid.fabArrayId;
  puVar4 = (undefined8 *)operator_new(0x48);
  *puVar4 = 0;
  puVar4[1] = 0x100000001;
  *(undefined4 *)(puVar4 + 2) = 1;
  *(undefined1 (*) [16])((long)puVar4 + 0x14) = (undefined1  [16])0x0;
  *(undefined4 *)((long)puVar4 + 0x24) = 0xffffffff;
  *(undefined4 *)(puVar4 + 5) = 0xffffffff;
  *(undefined4 *)((long)puVar4 + 0x2c) = 0xffffffff;
  *(undefined4 *)(puVar4 + 6) = 0xffffffff;
  *(undefined4 *)(puVar4 + 6) = 0xffffffff;
  *(undefined4 *)((long)puVar4 + 0x34) = 0xffffffff;
  *(undefined4 *)(puVar4 + 7) = 0xffffffff;
  *(undefined4 *)((long)puVar4 + 0x3c) = 0xffffffff;
  *(undefined4 *)(puVar4 + 8) = 2;
  *(undefined1 *)((long)puVar4 + 0x44) = 0;
  uVar12 = *(uint *)(*(long *)*(long *)&(this_01->super_FabArrayBase).distributionMap.m_ref.
                                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                    + (long)faindex * 4);
  local_1a8 = (ulong)uVar12;
  if ((int)uVar12 < *(int *)(ParallelContext::frames + 0x10)) goto LAB_00295aa8;
  uVar12 = *(uint *)(ParallelContext::frames + 0xc);
  uVar16 = -uVar12;
  if (0 < (int)uVar12) {
    uVar16 = uVar12;
  }
  uVar15 = 1;
  if (9 < uVar16) {
    uVar18 = (ulong)uVar16;
    uVar8 = 4;
    do {
      uVar15 = uVar8;
      uVar7 = (uint)uVar18;
      if (uVar7 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_002954c3;
      }
      if (uVar7 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_002954c3;
      }
      if (uVar7 < 10000) goto LAB_002954c3;
      uVar18 = uVar18 / 10000;
      uVar8 = uVar15 + 4;
    } while (99999 < uVar7);
    uVar15 = uVar15 + 1;
  }
LAB_002954c3:
  local_50[0] = local_40;
  local_1a0 = faindex;
  local_68 = this_01;
  local_60 = this;
  local_58 = returnedUnfilledBoxes;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar15 - (char)((int)uVar12 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(uVar12 >> 0x1f)),uVar15,uVar16);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x6a2ca5);
  local_d8 = &local_c8;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_c8 = *plVar9;
    lStack_c0 = plVar5[3];
  }
  else {
    local_c8 = *plVar9;
    local_d8 = (long *)*plVar5;
  }
  local_d0 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_198 = &local_188;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_188 = *puVar10;
    lStack_180 = plVar5[3];
  }
  else {
    local_188 = *puVar10;
    local_198 = (ulong *)*plVar5;
  }
  local_190 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar12 = *(uint *)(ParallelContext::frames + 0x10);
  uVar16 = -uVar12;
  if (0 < (int)uVar12) {
    uVar16 = uVar12;
  }
  uVar15 = 1;
  if (9 < uVar16) {
    uVar18 = (ulong)uVar16;
    uVar8 = 4;
    do {
      uVar15 = uVar8;
      uVar7 = (uint)uVar18;
      if (uVar7 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_00295634;
      }
      if (uVar7 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_00295634;
      }
      if (uVar7 < 10000) goto LAB_00295634;
      uVar18 = uVar18 / 10000;
      uVar8 = uVar15 + 4;
    } while (99999 < uVar7);
    uVar15 = uVar15 + 1;
  }
LAB_00295634:
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar15 - (char)((int)uVar12 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar12 >> 0x1f) + (long)local_178),uVar15,uVar16);
  uVar18 = 0xf;
  if (local_198 != &local_188) {
    uVar18 = local_188;
  }
  if (uVar18 < (ulong)(local_170 + local_190)) {
    uVar18 = 0xf;
    if (local_178 != local_168) {
      uVar18 = local_168[0];
    }
    if (uVar18 < (ulong)(local_170 + local_190)) goto LAB_002956a8;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_198);
  }
  else {
LAB_002956a8:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_178);
  }
  local_158 = &local_148;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_148 = *plVar5;
    uStack_140 = puVar6[3];
  }
  else {
    local_148 = *plVar5;
    local_158 = (long *)*puVar6;
  }
  local_150 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_e8 = *puVar10;
    lStack_e0 = plVar5[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar10;
    local_f8 = (ulong *)*plVar5;
  }
  local_f0 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar16 = (uint)local_1a8;
  uVar12 = -uVar16;
  if (0 < (int)uVar16) {
    uVar12 = uVar16;
  }
  uVar16 = 1;
  if (9 < uVar12) {
    uVar18 = (ulong)uVar12;
    uVar15 = 4;
    do {
      uVar16 = uVar15;
      uVar8 = (uint)uVar18;
      if (uVar8 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_002957e7;
      }
      if (uVar8 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_002957e7;
      }
      if (uVar8 < 10000) goto LAB_002957e7;
      uVar18 = uVar18 / 10000;
      uVar15 = uVar16 + 4;
    } while (99999 < uVar8);
    uVar16 = uVar16 + 1;
  }
LAB_002957e7:
  uVar18 = local_1a8 >> 0x1f & 1;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar16 + (char)uVar18);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)(uVar18 + (long)local_118),uVar16,uVar12);
  returnedUnfilledBoxes = local_58;
  uVar18 = 0xf;
  if (local_f8 != &local_e8) {
    uVar18 = local_e8;
  }
  if (uVar18 < (ulong)(local_110 + local_f0)) {
    uVar18 = 0xf;
    if (local_118 != local_108) {
      uVar18 = local_108[0];
    }
    if (uVar18 < (ulong)(local_110 + local_f0)) goto LAB_00295879;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_00295879:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_118);
  }
  local_138 = &local_128;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_128 = *plVar5;
    uStack_120 = puVar6[3];
  }
  else {
    local_128 = *plVar5;
    local_138 = (long *)*puVar6;
  }
  local_130 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_b8._16_4_ = (undefined4)*plVar9;
    local_b8._20_4_ = (undefined4)((ulong)*plVar9 >> 0x20);
    local_b8._24_4_ = (undefined4)plVar5[3];
    local_b8._28_4_ = (undefined4)((ulong)plVar5[3] >> 0x20);
    local_b8._0_8_ = local_b8 + 0x10;
  }
  else {
    local_b8._16_4_ = (undefined4)*plVar9;
    local_b8._20_4_ = (undefined4)((ulong)*plVar9 >> 0x20);
    local_b8._0_8_ = (long *)*plVar5;
  }
  local_b8._8_4_ = (undefined4)plVar5[1];
  local_b8._12_4_ = (undefined4)((ulong)plVar5[1] >> 0x20);
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Abort((string *)local_b8);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
  }
  this = local_60;
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  this_01 = local_68;
  faindex = local_1a0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    this_01 = local_68;
    faindex = local_1a0;
  }
LAB_00295aa8:
  *(int *)(puVar4 + 6) = this->nextFillBoxId;
  *(ulong *)((long)puVar4 + 0x14) = CONCAT44(local_1d8.bigend.vect[1],local_1d8.bigend.vect[0]);
  *(undefined8 *)((long)puVar4 + 0x1c) = local_1d8._20_8_;
  puVar4[1] = local_1d8.smallend.vect._0_8_;
  puVar4[2] = CONCAT44(local_1d8.bigend.vect[0],local_1d8.smallend.vect[2]);
  *(undefined4 *)((long)puVar4 + 0x24) = local_1b8;
  iVar3 = (int)local_1a8;
  *(int *)(puVar4 + 5) = iVar3;
  *(int *)((long)puVar4 + 0x2c) = faindex;
  *(int *)((long)puVar4 + 0x34) = local_1b4;
  *(int *)(puVar4 + 7) = destcomp;
  *(int *)((long)puVar4 + 0x3c) = numcomp;
  if (iVar3 < 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = iVar3 - (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | local_1a8 & 0xffffffff) %
                         (long)(int)ParallelDescriptor::m_Team._4_4_);
  }
  if (ParallelDescriptor::m_Team._12_4_ == iVar3) {
    *(undefined4 *)(puVar4 + 8) = 0;
    iVar3 = FabArrayBase::localindex(&this_01->super_FabArrayBase,faindex);
    *puVar4 = *(undefined8 *)
               (*(long *)&(this_01->m_fabs_v).
                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                          ._M_impl + (long)iVar3 * 8);
  }
  else {
    local_98 = (undefined1  [16])0x0;
    local_b8._16_4_ = 0;
    local_b8._20_4_ = 0;
    local_b8._24_4_ = 0;
    local_b8._28_4_ = 0;
    local_b8._0_4_ = 0;
    local_b8._4_4_ = 0;
    local_b8._8_4_ = 0;
    local_b8._12_4_ = 0;
    local_88._0_4_ = 1;
    local_88._4_4_ = 1;
    iStack_80 = 1;
    iStack_7c = 0;
    iStack_78 = 0;
    uStack_74._0_4_ = 0;
    uStack_74._4_4_ = 0;
    this->dataAvailable = false;
    *(undefined4 *)(puVar4 + 8) = 1;
    this_00 = (FArrayBox *)operator_new(0x48);
    FArrayBox::FArrayBox(this_00,&local_1d8,numcomp,true,false,(Arena *)0x0);
    *puVar4 = this_00;
    *(undefined1 *)((long)puVar4 + 0x44) = 1;
    local_98._4_4_ = this->nextFillBoxId;
    local_98._0_4_ = local_19c;
    local_b8._8_4_ = faindex;
    local_98._8_4_ = local_1b8;
    local_98._12_4_ = (int)local_1a8;
    iStack_78 = local_1d8.bigend.vect[1];
    uStack_74._0_4_ = local_1d8.bigend.vect[2];
    uStack_74._4_4_ = local_1d8.btype.itype;
    local_88._0_4_ = local_1d8.smallend.vect[0];
    local_88._4_4_ = local_1d8.smallend.vect[1];
    iStack_80 = local_1d8.smallend.vect[2];
    iStack_7c = local_1d8.bigend.vect[0];
    local_b8._16_4_ = local_1b4;
    local_b8._20_4_ = destcomp;
    local_b8._24_4_ = numcomp;
    __position._M_current =
         (this->fabComTagList).
         super__Vector_base<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->fabComTagList).
        super__Vector_base<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<amrex::FabArrayBase::FabComTag,std::allocator<amrex::FabArrayBase::FabComTag>>::
      _M_realloc_insert<amrex::FabArrayBase::FabComTag_const&>
                ((vector<amrex::FabArrayBase::FabComTag,std::allocator<amrex::FabArrayBase::FabComTag>>
                  *)&this->fabComTagList,__position,(FabComTag *)local_b8);
    }
    else {
      piVar14 = (int *)local_b8;
      for (lVar11 = 0x13; lVar11 != 0; lVar11 = lVar11 + -1) {
        (__position._M_current)->fromProc = *piVar14;
        piVar14 = piVar14 + (ulong)bVar17 * -2 + 1;
        __position._M_current = __position._M_current + (ulong)bVar17 * -8 + 4;
      }
      ppFVar1 = &(this->fabComTagList).
                 super__Vector_base<amrex::FabArrayBase::FabComTag,_std::allocator<amrex::FabArrayBase::FabComTag>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar1 = *ppFVar1 + 1;
    }
  }
  local_b8._0_4_ = *(undefined4 *)(puVar4 + 6);
  local_b8._8_4_ = SUB84(puVar4,0);
  local_b8._12_4_ = (undefined4)((ulong)puVar4 >> 0x20);
  std::
  _Rb_tree<int,std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>,std::_Select1st<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>
  ::_M_insert_equal<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>
            ((_Rb_tree<int,std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>,std::_Select1st<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>
              *)((this->fabCopyDescList).
                 super__Vector_base<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_1b0),
             (pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*> *)local_b8);
  if (returnedUnfilledBoxes != (BoxList *)0x0) {
    BoxDomain::rmBox(unfilledBoxDomain,&local_1d8);
  }
  return;
}

Assistant:

void
FabArrayCopyDescriptor<FAB>::AddBoxDoIt (FabArrayId fabarrayid,
                                         const Box& destFabBox,
                                         BoxList*   returnedUnfilledBoxes,
                                         int        faindex,
                                         int        srccomp,
                                         int        destcomp,
                                         int        numcomp,
                                         bool       bUseValidBox,
                                         BoxDomain& unfilledBoxDomain)
{
    const int myProc = ParallelDescriptor::MyProc();

    FabArray<FAB>* fabArray = fabArrays[fabarrayid.Id()];

    BL_ASSERT(faindex >= 0 && faindex < fabArray->size());

    Box intersect = destFabBox;

    if (bUseValidBox)
    {
        intersect &= fabArray->box(faindex);
    }
    else
    {
        intersect &= fabArray->fabbox(faindex);
    }

    if (intersect.ok())
    {
        FabCopyDescriptor<FAB>* fcd = new FabCopyDescriptor<FAB>;

        int remoteProc     = fabArray->DistributionMap()[faindex];
        if(remoteProc >= ParallelDescriptor::NProcs()) {
            amrex::Abort("Bad remoteProc: "
                         + std::to_string(ParallelDescriptor::MyProc())
                         + ":: _in AddBoxDoIt:  nProcs remoteProc = "
                         + std::to_string(ParallelDescriptor::NProcs())
                         + "  " + std::to_string(remoteProc) + "\n");
        }
        fcd->fillBoxId     = nextFillBoxId;
        fcd->subBox        = intersect;
        fcd->myProc        = myProc;
        fcd->copyFromProc  = remoteProc;
        fcd->copyFromIndex = faindex;
        fcd->srcComp       = srccomp;
        fcd->destComp      = destcomp;
        fcd->nComp         = numcomp;

        if (ParallelDescriptor::sameTeam(remoteProc))
        {
            //
            // Data is local.
            //
            fcd->fillType       = FillLocally;
            fcd->localFabSource = &(*fabArray)[faindex];
        }
        else
        {
            //
            // Data is remote.
            //
            FabArrayBase::FabComTag fabComTag;

            dataAvailable               = false;
            fcd->fillType               = FillRemotely;
            fcd->localFabSource         = new FAB(intersect, numcomp);
            fcd->cacheDataAllocated     = true;
            fabComTag.fabArrayId        = fabarrayid.Id();
            fabComTag.fillBoxId         = nextFillBoxId;
            fabComTag.fabIndex          = faindex;
            fabComTag.procThatNeedsData = myProc;
            fabComTag.procThatHasData   = remoteProc;
            fabComTag.box               = intersect;
            fabComTag.srcComp           = srccomp;
            fabComTag.destComp          = destcomp;
            fabComTag.nComp             = numcomp;
            //
            // Do not send the data yet.
            //
            fabComTagList.push_back(fabComTag);
        }

        fabCopyDescList[fabarrayid.Id()].insert(FCDMapValueType(fcd->fillBoxId,fcd));

        if (returnedUnfilledBoxes != 0)
        {
            unfilledBoxDomain.rmBox(intersect);
        }
    }
}